

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_input_is_mouse_click_down_in_rect(nk_input *i,nk_buttons id,nk_rect b,int down)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (i != (nk_input *)0x0) {
    iVar1 = nk_input_has_mouse_click_down_in_rect(i,id,b,down);
    if (iVar1 != 0) {
      uVar2 = (uint)((i->mouse).buttons[id].clicked != 0);
    }
  }
  return uVar2;
}

Assistant:

NK_API int
nk_input_is_mouse_click_down_in_rect(const struct nk_input *i, enum nk_buttons id,
    struct nk_rect b, int down)
{
    const struct nk_mouse_button *btn;
    if (!i) return nk_false;
    btn = &i->mouse.buttons[id];
    return (nk_input_has_mouse_click_down_in_rect(i, id, b, down) &&
            btn->clicked) ? nk_true : nk_false;
}